

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_9.c
# Opt level: O3

int mbc_case_fold(OnigCaseFoldType flag,OnigUChar **pp,OnigUChar *end,OnigUChar *lower)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = **pp;
  if ((flag >> 0x1e & 1) == 0 || (ulong)bVar1 != 0xdf) {
    if (((byte)flag & (char)bVar1 < '\0') == 0) {
      bVar1 = ""[bVar1];
    }
    *lower = bVar1;
    iVar2 = 1;
  }
  else {
    lower[0] = 's';
    lower[1] = 's';
    iVar2 = 2;
  }
  *pp = *pp + 1;
  return iVar2;
}

Assistant:

static int
mbc_case_fold(OnigCaseFoldType flag,
              const UChar** pp, const UChar* end ARG_UNUSED, UChar* lower)
{
  const UChar* p = *pp;

  if (*p == 0xdf && (flag & INTERNAL_ONIGENC_CASE_FOLD_MULTI_CHAR) != 0) {
    *lower++ = 's';
    *lower   = 's';
    (*pp)++;
    return 2;
  }

  if (CASE_FOLD_IS_NOT_ASCII_ONLY(flag) || ONIGENC_IS_ASCII_CODE(*p))
    *lower = ENC_ISO_8859_9_TO_LOWER_CASE(*p);
  else
    *lower = *p;

  (*pp)++;
  return 1;
}